

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  uint32_t index;
  reference this_00;
  ByteData local_68;
  ScriptWitness local_50;
  ScriptWitness *local_30;
  ScriptWitness *witness;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  uint32_t witness_index_local;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  witness = (ScriptWitness *)data;
  data_local._0_4_ = witness_index;
  data_local._4_4_ = tx_in_index;
  _witness_index_local = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  AbstractTransaction::SetScriptWitnessStack
            (&this->super_AbstractTransaction,tx_in_index,witness_index,data);
  this_00 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::operator[](&this->vin_,(ulong)data_local._4_4_);
  index = (uint32_t)data_local;
  ByteData::ByteData(&local_68,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)witness);
  AbstractTxIn::SetScriptWitnessStack(&local_50,&this_00->super_AbstractTxIn,index,&local_68);
  ByteData::~ByteData((ByteData *)0x4aa70d);
  local_30 = &local_50;
  ScriptWitness::ScriptWitness(__return_storage_ptr__,local_30);
  ScriptWitness::~ScriptWitness((ScriptWitness *)0x4aa730);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  AbstractTransaction::SetScriptWitnessStack(tx_in_index, witness_index, data);

  const ScriptWitness &witness =
      vin_[tx_in_index].SetScriptWitnessStack(witness_index, ByteData(data));
  return witness;
}